

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

ON_RenderContent * ON_RenderContentPrivate::NewRenderContentFromNode(ON_XMLNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_RenderContent *this;
  ON_wString *rhs;
  
  iVar2 = (*node->_vptr_ON_XMLNode[3])();
  rhs = (ON_wString *)CONCAT44(extraout_var,iVar2);
  bVar1 = ::operator==(L"material",rhs);
  if (bVar1) {
    this = (ON_RenderContent *)operator_new(0x240);
    ON_RenderMaterial::ON_RenderMaterial((ON_RenderMaterial *)this);
  }
  else {
    bVar1 = ::operator==(L"environment",rhs);
    if (bVar1) {
      this = (ON_RenderContent *)operator_new(0x240);
      ON_RenderEnvironment::ON_RenderEnvironment((ON_RenderEnvironment *)this);
    }
    else {
      bVar1 = ::operator==(L"texture",rhs);
      if (!bVar1) {
        return (ON_RenderContent *)0x0;
      }
      this = (ON_RenderContent *)operator_new(0x240);
      ON_RenderTexture::ON_RenderTexture((ON_RenderTexture *)this);
    }
  }
  SetXMLNode(this->_private,node);
  return this;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::NewRenderContentFromNode(const ON_XMLNode& node) // Static.
{
  ON_RenderContent* rc = nullptr;

  const ON_wString& kind = node.TagName();

  if (ON_KIND_MATERIAL == kind)
    rc = new ON_RenderMaterial;
  else
  if (ON_KIND_ENVIRONMENT == kind)
    rc = new ON_RenderEnvironment;
  else
  if (ON_KIND_TEXTURE == kind)
    rc = new ON_RenderTexture;

  if (nullptr != rc)
  {
    rc->_private->SetXMLNode(node);
  }

  return rc;
}